

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

cstr idx2::ToString<idx2::idx2_err_code>(error<idx2::idx2_err_code> *Err,bool Force)

{
  long *in_FS_OFFSET;
  stref sVar1;
  stref ErrStr;
  bool Force_local;
  error<idx2::idx2_err_code> *Err_local;
  
  if ((Force) || ((Err->StrGened & 1U) == 0)) {
    sVar1 = ToString(Err->Code);
    snprintf((char *)(*in_FS_OFFSET + -0x700),0x400,"%.*s (file: %s, line %d): %s",
             (ulong)(uint)sVar1.Size,sVar1.field_0.Ptr,*(undefined8 *)(*in_FS_OFFSET + -0x300),
             *(undefined4 *)(*in_FS_OFFSET + -0x100),Err->Msg);
  }
  return (cstr)(*in_FS_OFFSET + -0x700);
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}